

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess.h
# Opt level: O0

void __thiscall
subprocess::Popen::Popen<subprocess::input,subprocess::output,subprocess::error>
          (Popen *this,string *cmd_args,input *args,output *args_1,error *args_2)

{
  Popen *in_RSI;
  Popen *in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff30;
  error *args_1_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  output *args_00;
  input *farg;
  Streams *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  Popen *this_00;
  string *this_01;
  string *in_stack_ffffffffffffff80;
  Popen *this_02;
  allocator<char> local_41;
  error local_40 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  this_02 = in_RDI;
  detail::Streams::Streams(in_stack_ffffffffffffff58);
  __str = &this_00->exe_name_;
  std::__cxx11::string::string(in_stack_ffffffffffffff40);
  this_01 = &this_00->args_;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__str);
  args_00 = (output *)&in_RDI->vargs_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffff28);
  farg = (input *)&in_RDI->cargv_;
  std::vector<char_*,_std::allocator<char_*>_>::vector
            ((vector<char_*,_std::allocator<char_*>_> *)in_stack_ffffffffffffff28);
  in_RDI->child_pid_ = -1;
  in_RDI->retcode_ = -1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,(char *)this_00,(allocator<char> *)__str);
  util::split(in_stack_ffffffffffffff80,this_01);
  args_1_00 = local_40;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)args_1_00,in_stack_ffffffffffffff30);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)args_1_00);
  std::__cxx11::string::~string(in_stack_ffffffffffffff28);
  std::allocator<char>::~allocator(&local_41);
  init_args<subprocess::input,subprocess::output,subprocess::error>(in_RSI,farg,args_00,args_1_00);
  detail::Streams::setup_comm_channels(&in_RSI->stream_);
  execute_process(this_02);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Popen(const std::string& cmd_args, Args&& ...args):
    args_(cmd_args)
  {
    vargs_ = util::split(cmd_args);
    init_args(std::forward<Args>(args)...);

    // Setup the communication channels of the Popen class
    stream_.setup_comm_channels();

    execute_process();
  }